

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void update_mem_loc_alloca_flag(gen_ctx_t gen_ctx,size_t nloc,int flag)

{
  byte bVar1;
  size_t sVar2;
  mem_attr_t *pmVar3;
  char *pcVar4;
  
  sVar2 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
  if (sVar2 <= nloc) {
    __assert_fail("(VARR_mem_attr_tlength (gen_ctx->mem_attrs)) > nloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x103a,"void update_mem_loc_alloca_flag(gen_ctx_t, size_t, int)");
  }
  pmVar3 = VARR_mem_attr_taddr(gen_ctx->mem_attrs);
  bVar1 = pmVar3[nloc].alloca_flag;
  pmVar3[nloc].alloca_flag = (byte)flag & bVar1 & 2 | (bVar1 | (byte)flag) & 1;
  if ((((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) &&
     ((uint)bVar1 != flag)) {
    fprintf((FILE *)gen_ctx->debug_file,"    m%lu ",nloc);
    if (flag != 0) {
      pcVar4 = "may/must";
      if ((flag & 3U) == 0) {
        pcVar4 = "must";
      }
      fprintf((FILE *)gen_ctx->debug_file,"becomes %s alloca based\n",pcVar4);
      return;
    }
    fwrite("is no more alloca based\n",0x18,1,(FILE *)gen_ctx->debug_file);
    return;
  }
  return;
}

Assistant:

static void update_mem_loc_alloca_flag (gen_ctx_t gen_ctx, size_t nloc, int flag) {
  int old_flag;
  mem_attr_t *mem_attr_ref;

  gen_assert (VARR_LENGTH (mem_attr_t, mem_attrs) > nloc);
  mem_attr_ref = &VARR_ADDR (mem_attr_t, mem_attrs)[nloc];
  old_flag = mem_attr_ref->alloca_flag;
  mem_attr_ref->alloca_flag = ((old_flag | flag) & MAY_ALLOCA) | (old_flag & flag & MUST_ALLOCA);
  DEBUG (2, {
    if (flag != old_flag) {
      fprintf (debug_file, "    m%lu ", (unsigned long) nloc);
      if (!flag)
        fprintf (debug_file, "is no more alloca based\n");
      else
        fprintf (debug_file, "becomes %s alloca based\n",
                 flag & (MAY_ALLOCA | MUST_ALLOCA) ? "may/must"
                 : flag & MAY_ALLOCA               ? "may"
                                                   : "must");
    }
  });
}